

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O3

type rest_rpc::rpc_service::router::
     call_helper<void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&),0ul,std::__cxx11::string>
               (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f,index_sequence<0UL> *param_2,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *tup,weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  _Atomic_word *p_Var1;
  _func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *p_Var2;
  int iVar3;
  weak_ptr<rest_rpc::rpc_service::connection> wVar4;
  element_type *local_18;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  p_Var2 = *f;
  local_18 = (ptr->super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_10._M_pi =
       (ptr->super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_10._M_pi)->_M_weak_count = (local_10._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_10._M_pi)->_M_weak_count = (local_10._M_pi)->_M_weak_count + 1;
    }
  }
  wVar4.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tup;
  wVar4.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffe8;
  (*p_Var2)(wVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tup);
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_10._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_10._M_pi)->_M_weak_count;
      (local_10._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_10._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }